

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_setIdentityHash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_object_tuple_t *objectTuple;
  _Bool _Var1;
  sysbvm_size_t newIdentityHash;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(*arguments);
  if (!_Var1) {
    sysbvm_error("Cannot set the identity hash of an immediate value.");
  }
  objectTuple = (sysbvm_object_tuple_t *)*arguments;
  newIdentityHash = sysbvm_tuple_size_decode(arguments[1]);
  sysbvm_tuple_setIdentityHash(objectTuple,newIdentityHash);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_setIdentityHash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error("Cannot set the identity hash of an immediate value.");

    sysbvm_tuple_setIdentityHash((sysbvm_object_tuple_t*)arguments[0], sysbvm_tuple_size_decode(arguments[1]));
    return SYSBVM_VOID_TUPLE;
}